

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  u32 key;
  CellInfo info;
  
  if (*pRC == 0) {
    btreeParseCellPtr(pPage,pCell,&info);
    if ((ulong)info.iOverflow != 0) {
      key = sqlite3Get4byte(pCell + info.iOverflow);
      ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,pRC);
      return;
    }
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  btreeParseCellPtr(pPage, pCell, &info);
  assert( (info.nData+(pPage->intKey?0:info.nKey))==info.nPayload );
  if( info.iOverflow ){
    Pgno ovfl = get4byte(&pCell[info.iOverflow]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}